

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

bool __thiscall llvm::DWARFDie::addressRangeContainsAddress(DWARFDie *this,uint64_t Address)

{
  bool bVar1;
  undefined1 auVar2 [8];
  AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
  AVar3;
  undefined1 local_48 [8];
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  RangesOrError;
  anon_class_1_0_00000001 local_19;
  
  getAddressRanges((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                    *)local_48,this);
  auVar2 = local_48;
  if ((RangesOrError.field_0.TStorage.buffer[0x10] & 1U) == 0) {
    AVar3.buffer = (char  [8])local_48;
    if ((AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
         )local_48 != RangesOrError.field_0.ErrorStorage.buffer) {
      do {
        bVar1 = Address < *(ulong *)((long)AVar3.buffer + 8) && *(ulong *)AVar3.buffer <= Address;
        if (bVar1) break;
        AVar3.buffer = AVar3.buffer + 0x18;
      } while ((AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
                )AVar3.buffer != RangesOrError.field_0.ErrorStorage.buffer);
      goto LAB_00d6d6a6;
    }
  }
  else {
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    RangesOrError._24_8_ = (ulong)auVar2 | 1;
    handleAllErrors<llvm::consumeError(llvm::Error)::_lambda(llvm::ErrorInfoBase_const&)_1_>
              ((Error *)&RangesOrError.field_0x18,&local_19);
    if ((long *)(RangesOrError._24_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(RangesOrError._24_8_ & 0xfffffffffffffffe) + 8))();
    }
  }
  bVar1 = false;
LAB_00d6d6a6:
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
  ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             *)local_48);
  return bVar1;
}

Assistant:

bool DWARFDie::addressRangeContainsAddress(const uint64_t Address) const {
  auto RangesOrError = getAddressRanges();
  if (!RangesOrError) {
    llvm::consumeError(RangesOrError.takeError());
    return false;
  }

  for (const auto &R : RangesOrError.get())
    if (R.LowPC <= Address && Address < R.HighPC)
      return true;
  return false;
}